

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

idx_t __thiscall
duckdb::RowGroupCollection::Delete
          (RowGroupCollection *this,TransactionData transaction,DataTable *table,row_t *ids,
          idx_t count)

{
  ulong uVar1;
  ulong uVar2;
  RowGroupSegmentTree *this_00;
  RowGroup *this_01;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  
  iVar8 = 0;
  uVar9 = 0;
  do {
    this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
    this_01 = SegmentTree<duckdb::RowGroup,_true>::GetSegment
                        (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,ids[uVar9]);
    uVar1 = uVar9 + 1;
    uVar4 = uVar9;
    uVar6 = uVar1;
    if (uVar1 < count) {
      uVar6 = count;
    }
    while (uVar5 = uVar1, uVar7 = uVar6, uVar5 < count) {
      uVar2 = (this_01->super_SegmentBase<duckdb::RowGroup>).start;
      uVar7 = uVar4 + 1;
      if (((ulong)ids[uVar5] < uVar2) ||
         (uVar4 = uVar4 + 1, uVar1 = uVar5 + 1, uVar7 = uVar5,
         (this_01->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>.
         _M_i + uVar2 <= (ulong)ids[uVar5])) break;
    }
    iVar3 = RowGroup::Delete(this_01,transaction,table,ids + uVar9,uVar7 - uVar9);
    iVar8 = iVar8 + iVar3;
    uVar9 = uVar7;
    if (count <= uVar5) {
      return iVar8;
    }
  } while( true );
}

Assistant:

idx_t RowGroupCollection::Delete(TransactionData transaction, DataTable &table, row_t *ids, idx_t count) {
	idx_t delete_count = 0;
	// delete is in the row groups
	// we need to figure out for each id to which row group it belongs
	// usually all (or many) ids belong to the same row group
	// we iterate over the ids and check for every id if it belongs to the same row group as their predecessor
	idx_t pos = 0;
	do {
		idx_t start = pos;
		auto row_group = row_groups->GetSegment(UnsafeNumericCast<idx_t>(ids[start]));
		for (pos++; pos < count; pos++) {
			D_ASSERT(ids[pos] >= 0);
			// check if this id still belongs to this row group
			if (idx_t(ids[pos]) < row_group->start) {
				// id is before row_group start -> it does not
				break;
			}
			if (idx_t(ids[pos]) >= row_group->start + row_group->count) {
				// id is after row group end -> it does not
				break;
			}
		}
		delete_count += row_group->Delete(transaction, table, ids + start, pos - start);
	} while (pos < count);

	return delete_count;
}